

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O0

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::ProcessRRow::operator()
          (ProcessRRow *this,iterator_t *str,iterator_t *end)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  undefined8 uVar4;
  size_type sVar5;
  DecPOMDPDiscrete *pDVar6;
  reference pvVar7;
  reference puVar8;
  reference pvVar9;
  vector<double,_std::allocator<double>_> *pvVar10;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_RSI;
  long *in_RDI;
  Index joI;
  Index sucSI;
  iterator sucSI_last;
  iterator sucSI_it;
  Index jaI;
  iterator jaI_last;
  iterator jaI_it;
  Index sI;
  iterator sI_last;
  iterator sI_it;
  Index si_1;
  Index si;
  stringstream ss_3;
  size_t nrJO;
  size_t nrS;
  vector<double,_std::allocator<double>_> row;
  stringstream ss_2;
  stringstream ss_1;
  stringstream ss;
  uint in_stack_fffffffffffff808;
  uint in_stack_fffffffffffff80c;
  uint in_stack_fffffffffffff810;
  uint in_stack_fffffffffffff814;
  DecPOMDPDiscrete *in_stack_fffffffffffff818;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff820;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff858;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff860;
  uint local_6c0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_6b0;
  uint local_6a4;
  uint *local_6a0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_698;
  uint local_68c;
  uint *local_688;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_680;
  uint local_678;
  uint local_674;
  stringstream local_670 [16];
  ostream local_660 [376];
  size_type local_4e8;
  ulong local_4e0;
  vector<double,_std::allocator<double>_> local_4d8;
  stringstream local_4c0 [16];
  ostream local_4b0 [376];
  stringstream local_338 [16];
  ostream local_328 [392];
  stringstream local_1a0 [16];
  ostream local_190 [400];
  
  if (*(int *)(*in_RDI + 0x40) != 1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"ProcessRRow:last parsed type should be a double. (at ");
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::get_position(in_RSI);
    poVar3 = DPOMDPFormatParsing::operator<<
                       ((ostream *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                        (file_position *)
                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    poVar3 = std::operator<<(poVar3,")");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    uVar4 = __cxa_allocate_exception(0x28);
    E::E((E *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
         (stringstream *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    __cxa_throw(uVar4,&E::typeinfo,E::~E);
  }
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x118));
  if (sVar5 != 1) {
    std::__cxx11::stringstream::stringstream(local_338);
    std::operator<<(local_328,"ProcessRRow:_m_lp_fromSI has size != 1. (at ");
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::get_position(in_RSI);
    poVar3 = DPOMDPFormatParsing::operator<<
                       ((ostream *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                        (file_position *)
                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    poVar3 = std::operator<<(poVar3,")");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    uVar4 = __cxa_allocate_exception(0x28);
    E::E((E *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
         (stringstream *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    __cxa_throw(uVar4,&E::typeinfo,E::~E);
  }
  bVar2 = IsRowMatrixLP((ParserDPOMDPFormat_Spirit *)
                        CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
  if (!bVar2) {
    std::__cxx11::stringstream::stringstream(local_4c0);
    std::operator<<(local_4b0,"ProcessRRow: a row matrix should have been parsed. (at ");
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::get_position(in_RSI);
    poVar3 = DPOMDPFormatParsing::operator<<
                       ((ostream *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                        (file_position *)
                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    poVar3 = std::operator<<(poVar3,")");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    uVar4 = __cxa_allocate_exception(0x28);
    E::E((E *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
         (stringstream *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    __cxa_throw(uVar4,&E::typeinfo,E::~E);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)(*in_RDI + 0x60),0);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  pDVar6 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
  local_4e0 = (**(code **)(*(long *)&(pDVar6->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 0x30))();
  pDVar6 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
  local_4e8 = (**(code **)(*(long *)&(pDVar6->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 0xd0))();
  sVar5 = std::vector<double,_std::allocator<double>_>::size(&local_4d8);
  if (sVar5 == local_4e8) {
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x100),0);
    if (*pvVar7 == *(value_type *)(*in_RDI + 0x5c)) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa07307);
      local_674 = 0;
      while( true ) {
        pvVar10 = (vector<double,_std::allocator<double>_> *)(ulong)local_674;
        pDVar6 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
        in_stack_fffffffffffff820 =
             (vector<double,_std::allocator<double>_> *)
             (**(code **)(*(long *)&(pDVar6->super_MultiAgentDecisionProcessDiscrete).
                                    super_MultiAgentDecisionProcess + 0x30))();
        if (in_stack_fffffffffffff820 <= pvVar10) break;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff820,
                   (value_type_conflict1 *)in_stack_fffffffffffff818);
        local_674 = local_674 + 1;
      }
    }
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x118),0);
    if (*pvVar7 == *(value_type *)(*in_RDI + 0x5c)) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa073d5);
      for (local_678 = 0; local_678 < local_4e0; local_678 = local_678 + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff820,
                   (value_type_conflict1 *)in_stack_fffffffffffff818);
      }
    }
    local_680._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    local_688 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808)),
          bVar2) {
      puVar8 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_680);
      local_68c = *puVar8;
      local_698._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
      local_6a0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                                (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808)),
            bVar2) {
        puVar8 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_698);
        local_6a4 = *puVar8;
        local_6b0._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                                  (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808)),
              bVar2) {
          puVar8 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&local_6b0);
          uVar1 = *puVar8;
          for (local_6c0 = 0; local_6c0 < local_4e8; local_6c0 = local_6c0 + 1) {
            in_stack_fffffffffffff818 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
            in_stack_fffffffffffff808 = local_68c;
            in_stack_fffffffffffff80c = local_6a4;
            in_stack_fffffffffffff810 = uVar1;
            in_stack_fffffffffffff814 = local_6c0;
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_4d8,(ulong)local_6c0);
            (**(code **)(*(long *)&(in_stack_fffffffffffff818->
                                   super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 400))
                      (*pvVar9,in_stack_fffffffffffff818,in_stack_fffffffffffff808,
                       in_stack_fffffffffffff80c,in_stack_fffffffffffff810,in_stack_fffffffffffff814
                      );
          }
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_fffffffffffff818,in_stack_fffffffffffff814);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)in_stack_fffffffffffff818,in_stack_fffffffffffff814);
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)in_stack_fffffffffffff818,in_stack_fffffffffffff814);
    }
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff820);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_670);
  poVar3 = std::operator<<(local_660,"ProcessRRow: exected a row matrix with nrJO=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_4e8);
  poVar3 = std::operator<<(poVar3," entries. Found ");
  sVar5 = std::vector<double,_std::allocator<double>_>::size(&local_4d8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
  std::operator<<(poVar3," entries. (at ");
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::get_position(in_RSI);
  poVar3 = DPOMDPFormatParsing::operator<<
                     ((ostream *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                      (file_position *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808)
                     );
  poVar3 = std::operator<<(poVar3,")");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  uVar4 = __cxa_allocate_exception(0x28);
  E::E((E *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
       (stringstream *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  __cxa_throw(uVar4,&E::typeinfo,E::~E);
}

Assistant:

void ParserDPOMDPFormat_Spirit::ProcessRRow::operator()(iterator_t str, iterator_t end) const
{
    if(_m_po->_m_lp_type != DOUBLE)
    {
        stringstream ss; ss<<"ProcessRRow:last parsed type should be a double. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }   
    //an actual matrix was parsed, check curMatrix size
    if( _m_po->_m_lp_toSI.size() != 1 )
    {
        stringstream ss; ss<<"ProcessRRow:_m_lp_fromSI has size != 1. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    if( !_m_po->IsRowMatrixLP() )
    {
        stringstream ss; ss<<"ProcessRRow: a row matrix should have been parsed. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    vector<double> row = _m_po->_m_curMatrix[0];
    size_t nrS = _m_po->GetDecPOMDPDiscrete()->GetNrStates();
    size_t nrJO = _m_po->GetDecPOMDPDiscrete()->GetNrJointObservations();
    if( row.size() != nrJO)
    {
        stringstream ss; ss<<"ProcessRRow: exected a row matrix with nrJO="<<nrJO<<" entries. Found "<<row.size()<< " entries. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }

    if( _m_po->_m_lp_fromSI[0] == _m_po->_m_anyStateIndex )
    {
        _m_po->_m_lp_fromSI.clear();
        for(Index si=0; si < _m_po->GetDecPOMDPDiscrete()->GetNrStates();si++)
            _m_po->_m_lp_fromSI.push_back(si);
    }
    if( _m_po->_m_lp_toSI[0] == _m_po->_m_anyStateIndex )
    {
        _m_po->_m_lp_toSI.clear();
        for(Index si=0; si < nrS; si++)
            _m_po->_m_lp_toSI.push_back(si);
    }    

    vector<Index>::iterator sI_it = _m_po->_m_lp_fromSI.begin();
    vector<Index>::iterator sI_last = _m_po->_m_lp_fromSI.end();
    while(sI_it != sI_last)
    {
        Index sI = *sI_it;
        vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
        vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
        while(jaI_it != jaI_last)
        {
            Index jaI = *jaI_it;
            vector<Index>::iterator sucSI_it = _m_po->_m_lp_toSI.begin();
            vector<Index>::iterator sucSI_last = _m_po->_m_lp_toSI.end();
            while(sucSI_it != sucSI_last)
            {
                Index sucSI = *sucSI_it;
                for(Index joI=0; joI < nrJO; joI++) 
                {
                    _m_po->GetDecPOMDPDiscrete()->SetReward(sI, jaI, sucSI,joI, 
                        row[joI]);
                    if(DEBUG_PARSE)
                        cout << "Setting R("<<sI<<","<<jaI<<","<<sucSI<<
                            ","<<joI<<") = "<<row[joI]<<endl;
                }
                sucSI_it++;
            }
            jaI_it++;
        }
        sI_it++;
    }
}